

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O0

CheckedError __thiscall flatbuffers::Parser::Next(Parser *this)

{
  char *pcVar1;
  char *pcVar2;
  bool bVar3;
  uint ucc;
  int iVar4;
  ParserState *in_RSI;
  bool local_3f1;
  char *local_3f0;
  bool local_3e2;
  bool local_3e1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_328;
  string local_308;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e8;
  undefined1 local_2c8 [8];
  string ch;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_280;
  bool local_259;
  char *pcStack_258;
  bool use_hex;
  char *start_digits;
  char *start_2;
  int dot_lvl;
  bool has_sign;
  char *start_1;
  string local_230 [39];
  allocator<char> local_209;
  value_type local_208;
  allocator<char> local_1e1;
  string local_1e0 [32];
  char *local_1c0;
  char *start;
  string local_1b0 [39];
  allocator<char> local_189;
  string local_188 [39];
  allocator<char> local_161;
  string local_160 [39];
  allocator<char> local_139;
  string local_138 [39];
  allocator<char> local_111;
  string local_110 [32];
  uint32_t local_f0;
  allocator<char> local_e9;
  int code_point;
  allocator<char> local_c1;
  string local_c0 [39];
  byte local_99;
  ulong local_98;
  uint64_t val_1;
  undefined8 local_88;
  uint64_t val;
  string local_78 [55];
  allocator<char> local_41;
  string local_40 [32];
  uint local_20;
  char local_1a;
  byte local_19;
  int unicode_high_surrogate;
  char c;
  bool seen_newline;
  Parser *this_local;
  CheckedError *ce;
  
  this_local = this;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&in_RSI->doc_comment_);
  in_RSI->prev_cursor_ = in_RSI->cursor_;
  local_19 = in_RSI->cursor_ == in_RSI[0x13].cursor_;
  std::__cxx11::string::clear();
  in_RSI->attr_is_trivial_ascii_string_ = true;
LAB_00109a7d:
  pcVar1 = in_RSI->cursor_;
  in_RSI->cursor_ = pcVar1 + 1;
  local_1a = *pcVar1;
  in_RSI->token_ = (int)local_1a;
  switch(local_1a) {
  case '\0':
    in_RSI->cursor_ = in_RSI->cursor_ + -1;
    in_RSI->token_ = 0x100;
    anon_unknown_0::NoError();
    break;
  default:
switchD_00109ac9_caseD_1:
    bVar3 = anon_unknown_0::IsIdentifierStart(local_1a);
    if (bVar3) {
      _dot_lvl = in_RSI->cursor_ + -1;
      while( true ) {
        bVar3 = anon_unknown_0::IsIdentifierStart(*in_RSI->cursor_);
        local_3e1 = true;
        if (!bVar3) {
          local_3e1 = is_digit(*in_RSI->cursor_);
        }
        if (local_3e1 == false) break;
        in_RSI->cursor_ = in_RSI->cursor_ + 1;
      }
      std::__cxx11::string::append<char_const*,void>
                ((string *)&in_RSI->attribute_,_dot_lvl,in_RSI->cursor_);
      in_RSI->token_ = 0x104;
      anon_unknown_0::NoError();
      break;
    }
    local_3e2 = local_1a == '+' || local_1a == '-';
    start_2._7_1_ = local_3e2;
    if (local_1a == '+' || local_1a == '-') {
      iVar4 = strncmp(in_RSI->cursor_,"inf",3);
      if (((iVar4 == 0) && (bVar3 = anon_unknown_0::IsIdentifierStart(in_RSI->cursor_[3]), !bVar3))
         && (bVar3 = is_digit(in_RSI->cursor_[3]), !bVar3)) {
        std::__cxx11::string::assign<char_const*,void>
                  ((string *)&in_RSI->attribute_,in_RSI->cursor_ + -1,in_RSI->cursor_ + 3);
        in_RSI->token_ = 0x103;
        in_RSI->cursor_ = in_RSI->cursor_ + 3;
        anon_unknown_0::NoError();
        break;
      }
      bVar3 = anon_unknown_0::IsIdentifierStart(*in_RSI->cursor_);
      if (bVar3) {
        anon_unknown_0::NoError();
        break;
      }
    }
    start_2._0_4_ = (uint)(local_1a != '.');
    if (((uint)start_2 != 0) || (bVar3 = is_digit(*in_RSI->cursor_), bVar3)) {
      bVar3 = is_digit(local_1a);
      if ((bVar3) || (((start_2._7_1_ & 1) != 0 || ((uint)start_2 == 0)))) {
        start_digits = in_RSI->cursor_ + -1;
        bVar3 = is_digit(local_1a);
        if (bVar3) {
          local_3f0 = in_RSI->cursor_ + -1;
        }
        else {
          local_3f0 = in_RSI->cursor_;
        }
        pcStack_258 = local_3f0;
        bVar3 = is_digit(local_1a);
        if ((!bVar3) && (bVar3 = is_digit(*in_RSI->cursor_), bVar3)) {
          pcStack_258 = in_RSI->cursor_;
          pcVar1 = in_RSI->cursor_;
          in_RSI->cursor_ = pcVar1 + 1;
          local_1a = *pcVar1;
        }
        local_3f1 = false;
        if (((uint)start_2 != 0) && (local_3f1 = false, local_1a == '0')) {
          local_3f1 = is_alpha_char(*in_RSI->cursor_,'X');
        }
        local_259 = local_3f1;
        if (local_3f1 != false) {
          pcStack_258 = in_RSI->cursor_ + 1;
          in_RSI->cursor_ = pcStack_258;
        }
        do {
          if ((local_259 & 1U) == 0) {
            while (bVar3 = is_digit(*in_RSI->cursor_), bVar3) {
              in_RSI->cursor_ = in_RSI->cursor_ + 1;
            }
          }
          else {
            while (bVar3 = is_xdigit(*in_RSI->cursor_), bVar3) {
              in_RSI->cursor_ = in_RSI->cursor_ + 1;
            }
          }
          bVar3 = false;
          if (*in_RSI->cursor_ == '.') {
            pcVar1 = in_RSI->cursor_;
            in_RSI->cursor_ = pcVar1 + 1;
            bVar3 = false;
            if (pcVar1 + 1 != (char *)0x0) {
              start_2._0_4_ = (uint)start_2 - 1;
              bVar3 = -1 < (int)(uint)start_2;
            }
          }
        } while (bVar3);
        if ((-1 < (int)(uint)start_2) && (pcStack_258 < in_RSI->cursor_)) {
          if (((local_259 & 1U) != 0) && ((uint)start_2 == 0)) {
            pcStack_258 = in_RSI->cursor_;
          }
          if ((((local_259 & 1U) != 0) && (bVar3 = is_alpha_char(*in_RSI->cursor_,'P'), bVar3)) ||
             (bVar3 = is_alpha_char(*in_RSI->cursor_,'E'), bVar3)) {
            start_2._0_4_ = 0;
            in_RSI->cursor_ = in_RSI->cursor_ + 1;
            if ((*in_RSI->cursor_ == '+') || (*in_RSI->cursor_ == '-')) {
              in_RSI->cursor_ = in_RSI->cursor_ + 1;
            }
            pcStack_258 = in_RSI->cursor_;
            while (bVar3 = is_digit(*in_RSI->cursor_), bVar3) {
              in_RSI->cursor_ = in_RSI->cursor_ + 1;
            }
            if (*in_RSI->cursor_ == '.') {
              in_RSI->cursor_ = in_RSI->cursor_ + 1;
              start_2._0_4_ = 0xffffffff;
            }
          }
        }
        pcVar1 = start_digits;
        if (((int)(uint)start_2 < 0) || (in_RSI->cursor_ <= pcStack_258)) {
          pcVar2 = in_RSI->cursor_;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<char_const*,void>
                    ((string *)&local_2a0,pcVar1,pcVar2,
                     (allocator<char> *)(ch.field_2._M_local_buf + 0xf));
          std::operator+(&local_280,"invalid number: ",&local_2a0);
          Error(this,(string *)in_RSI);
          std::__cxx11::string::~string((string *)&local_280);
          std::__cxx11::string::~string((string *)&local_2a0);
          std::allocator<char>::~allocator((allocator<char> *)(ch.field_2._M_local_buf + 0xf));
        }
        else {
          std::__cxx11::string::append<char_const*,void>
                    ((string *)&in_RSI->attribute_,start_digits,in_RSI->cursor_);
          iVar4 = 0x103;
          if ((uint)start_2 != 0) {
            iVar4 = 0x102;
          }
          in_RSI->token_ = iVar4;
          anon_unknown_0::NoError();
        }
      }
      else {
        std::__cxx11::string::string((string *)local_2c8);
        std::__cxx11::string::operator=((string *)local_2c8,local_1a);
        bVar3 = check_ascii_range(local_1a,' ','~');
        if (!bVar3) {
          NumToString<char>(&local_308,local_1a);
          std::operator+(&local_2e8,"code: ",&local_308);
          std::__cxx11::string::operator=((string *)local_2c8,(string *)&local_2e8);
          std::__cxx11::string::~string((string *)&local_2e8);
          std::__cxx11::string::~string((string *)&local_308);
        }
        std::operator+(&local_328,"illegal character: ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_2c8);
        Error(this,(string *)in_RSI);
        std::__cxx11::string::~string((string *)&local_328);
        val_1._0_4_ = 1;
        std::__cxx11::string::~string((string *)local_2c8);
      }
    }
    else {
      anon_unknown_0::NoError();
    }
    break;
  case '\t':
  case '\r':
  case ' ':
    goto LAB_00109a7d;
  case '\n':
    ParserState::MarkNewLine(in_RSI);
    local_19 = 1;
    goto LAB_00109a7d;
  case '\"':
  case '\'':
    local_20 = 0xffffffff;
    ucc = local_20;
    goto LAB_00109b28;
  case '(':
  case ')':
  case ',':
  case ':':
  case ';':
  case '<':
  case '=':
  case '>':
  case '[':
  case ']':
  case '{':
  case '}':
    anon_unknown_0::NoError();
    break;
  case '/':
    if (*in_RSI->cursor_ == '/') {
      pcVar1 = in_RSI->cursor_;
      local_1c0 = pcVar1 + 1;
      in_RSI->cursor_ = local_1c0;
      while( true ) {
        bVar3 = false;
        if ((*in_RSI->cursor_ != '\0') && (bVar3 = false, *in_RSI->cursor_ != '\n')) {
          bVar3 = *in_RSI->cursor_ != '\r';
        }
        if (!bVar3) break;
        in_RSI->cursor_ = in_RSI->cursor_ + 1;
      }
      if (*local_1c0 == '/') {
        if ((local_19 & 1) == 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (local_1e0,"a documentation comment should be on a line on its own",&local_1e1);
          Error(this,(string *)in_RSI);
          std::__cxx11::string::~string(local_1e0);
          std::allocator<char>::~allocator(&local_1e1);
          break;
        }
        pcVar2 = in_RSI->cursor_;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<char_const*,void>
                  ((string *)&local_208,pcVar1 + 2,pcVar2,&local_209);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&in_RSI->doc_comment_,&local_208);
        std::__cxx11::string::~string((string *)&local_208);
        std::allocator<char>::~allocator(&local_209);
      }
    }
    else {
      if (*in_RSI->cursor_ != '*') goto switchD_00109ac9_caseD_1;
      in_RSI->cursor_ = in_RSI->cursor_ + 1;
      while( true ) {
        bVar3 = true;
        if (*in_RSI->cursor_ == '*') {
          bVar3 = in_RSI->cursor_[1] != '/';
        }
        if (!bVar3) break;
        if (*in_RSI->cursor_ == '\n') {
          ParserState::MarkNewLine(in_RSI);
        }
        if (*in_RSI->cursor_ == '\0') {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (local_230,"end of file in comment",(allocator<char> *)((long)&start_1 + 7));
          Error(this,(string *)in_RSI);
          std::__cxx11::string::~string(local_230);
          std::allocator<char>::~allocator((allocator<char> *)((long)&start_1 + 7));
          goto LAB_0010b21e;
        }
        in_RSI->cursor_ = in_RSI->cursor_ + 1;
      }
      in_RSI->cursor_ = in_RSI->cursor_ + 2;
    }
    goto LAB_00109a7d;
  }
  goto LAB_0010b21e;
LAB_00109b28:
  local_20 = ucc;
  if (*in_RSI->cursor_ == local_1a) {
    if (local_20 == 0xffffffff) {
      in_RSI->cursor_ = in_RSI->cursor_ + 1;
      if ((((in_RSI->attr_is_trivial_ascii_string_ & 1U) != 0) ||
          ((in_RSI[0xc].attribute_.field_2._M_local_buf[1] & 1U) != 0)) ||
         (bVar3 = anon_unknown_0::ValidateUTF8(&in_RSI->attribute_), bVar3)) {
        in_RSI->token_ = 0x101;
        anon_unknown_0::NoError();
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (local_1b0,"illegal UTF-8 sequence",(allocator<char> *)((long)&start + 7));
        Error(this,(string *)in_RSI);
        std::__cxx11::string::~string(local_1b0);
        std::allocator<char>::~allocator((allocator<char> *)((long)&start + 7));
      }
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (local_188,"illegal Unicode sequence (unpaired high surrogate)",&local_189);
      Error(this,(string *)in_RSI);
      std::__cxx11::string::~string(local_188);
      std::allocator<char>::~allocator(&local_189);
    }
    goto LAB_0010b21e;
  }
  if ((*in_RSI->cursor_ < ' ') && (-1 < *in_RSI->cursor_)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (local_40,"illegal character in string constant",&local_41);
    Error(this,(string *)in_RSI);
    std::__cxx11::string::~string(local_40);
    std::allocator<char>::~allocator(&local_41);
    goto LAB_0010b21e;
  }
  if (*in_RSI->cursor_ != '\\') {
    if (local_20 != 0xffffffff) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (local_160,"illegal Unicode sequence (unpaired high surrogate)",&local_161);
      Error(this,(string *)in_RSI);
      std::__cxx11::string::~string(local_160);
      std::allocator<char>::~allocator(&local_161);
      goto LAB_0010b21e;
    }
    bVar3 = check_ascii_range(*in_RSI->cursor_,' ','~');
    in_RSI->attr_is_trivial_ascii_string_ =
         (in_RSI->attr_is_trivial_ascii_string_ & 1U & bVar3) != 0;
    pcVar1 = in_RSI->cursor_;
    in_RSI->cursor_ = pcVar1 + 1;
    std::__cxx11::string::operator+=((string *)&in_RSI->attribute_,*pcVar1);
    ucc = local_20;
    goto LAB_00109b28;
  }
  in_RSI->attr_is_trivial_ascii_string_ = false;
  in_RSI->cursor_ = in_RSI->cursor_ + 1;
  if ((local_20 != 0xffffffff) && (*in_RSI->cursor_ != 'u')) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (local_78,"illegal Unicode sequence (unpaired high surrogate)",
               (allocator<char> *)((long)&val + 7));
    Error(this,(string *)in_RSI);
    std::__cxx11::string::~string(local_78);
    std::allocator<char>::~allocator((allocator<char> *)((long)&val + 7));
    goto LAB_0010b21e;
  }
  switch(*in_RSI->cursor_) {
  case '\"':
    std::__cxx11::string::operator+=((string *)&in_RSI->attribute_,'\"');
    in_RSI->cursor_ = in_RSI->cursor_ + 1;
    ucc = local_20;
    goto LAB_00109b28;
  default:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (local_138,"unknown escape code in string constant",&local_139);
    Error(this,(string *)in_RSI);
    std::__cxx11::string::~string(local_138);
    std::allocator<char>::~allocator(&local_139);
    break;
  case '\'':
    std::__cxx11::string::operator+=((string *)&in_RSI->attribute_,'\'');
    in_RSI->cursor_ = in_RSI->cursor_ + 1;
    ucc = local_20;
    goto LAB_00109b28;
  case '/':
    std::__cxx11::string::operator+=((string *)&in_RSI->attribute_,'/');
    in_RSI->cursor_ = in_RSI->cursor_ + 1;
    ucc = local_20;
    goto LAB_00109b28;
  case '\\':
    std::__cxx11::string::operator+=((string *)&in_RSI->attribute_,'\\');
    in_RSI->cursor_ = in_RSI->cursor_ + 1;
    ucc = local_20;
    goto LAB_00109b28;
  case 'b':
    std::__cxx11::string::operator+=((string *)&in_RSI->attribute_,'\b');
    in_RSI->cursor_ = in_RSI->cursor_ + 1;
    ucc = local_20;
    goto LAB_00109b28;
  case 'f':
    std::__cxx11::string::operator+=((string *)&in_RSI->attribute_,'\f');
    in_RSI->cursor_ = in_RSI->cursor_ + 1;
    ucc = local_20;
    goto LAB_00109b28;
  case 'n':
    std::__cxx11::string::operator+=((string *)&in_RSI->attribute_,'\n');
    in_RSI->cursor_ = in_RSI->cursor_ + 1;
    ucc = local_20;
    goto LAB_00109b28;
  case 'r':
    std::__cxx11::string::operator+=((string *)&in_RSI->attribute_,'\r');
    in_RSI->cursor_ = in_RSI->cursor_ + 1;
    ucc = local_20;
    goto LAB_00109b28;
  case 't':
    std::__cxx11::string::operator+=((string *)&in_RSI->attribute_,'\t');
    in_RSI->cursor_ = in_RSI->cursor_ + 1;
    ucc = local_20;
    goto LAB_00109b28;
  case 'u':
    in_RSI->cursor_ = in_RSI->cursor_ + 1;
    local_99 = 0;
    ParseHexNum(this,(int)in_RSI,(uint64_t *)0x4);
    bVar3 = CheckedError::Check((CheckedError *)this);
    if (bVar3) {
      local_99 = 1;
    }
    val_1._0_4_ = (uint)bVar3;
    if ((local_99 & 1) == 0) {
      CheckedError::~CheckedError((CheckedError *)this);
    }
    if ((uint)val_1 != 0) break;
    ucc = (uint)local_98;
    if ((local_98 < 0xd800) || (0xdbff < local_98)) {
      if ((local_98 < 0xdc00) || (0xdfff < local_98)) {
        if (local_20 != 0xffffffff) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (local_110,"illegal Unicode sequence (unpaired high surrogate)",&local_111);
          Error(this,(string *)in_RSI);
          std::__cxx11::string::~string(local_110);
          std::allocator<char>::~allocator(&local_111);
          break;
        }
        ToUTF8(ucc,&in_RSI->attribute_);
        ucc = local_20;
      }
      else {
        if (local_20 == 0xffffffff) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&code_point,"illegal Unicode sequence (unpaired low surrogate)",
                     &local_e9);
          Error(this,(string *)in_RSI);
          std::__cxx11::string::~string((string *)&code_point);
          std::allocator<char>::~allocator(&local_e9);
          break;
        }
        local_f0 = (local_20 & 0x3ff) * 0x400 + 0x10000 + (ucc & 0x3ff);
        ToUTF8(local_f0,&in_RSI->attribute_);
        local_20 = 0xffffffff;
        ucc = local_20;
      }
      goto LAB_00109b28;
    }
    if (local_20 == 0xffffffff) goto LAB_00109b28;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (local_c0,"illegal Unicode sequence (multiple high surrogates)",&local_c1);
    Error(this,(string *)in_RSI);
    std::__cxx11::string::~string(local_c0);
    std::allocator<char>::~allocator(&local_c1);
    break;
  case 'x':
    in_RSI->cursor_ = in_RSI->cursor_ + 1;
    val_1._7_1_ = 0;
    ParseHexNum(this,(int)in_RSI,(uint64_t *)0x2);
    bVar3 = CheckedError::Check((CheckedError *)this);
    if (bVar3) {
      val_1._7_1_ = 1;
    }
    val_1._0_4_ = (uint)bVar3;
    if ((val_1._7_1_ & 1) == 0) {
      CheckedError::~CheckedError((CheckedError *)this);
    }
    if ((uint)val_1 != 0) break;
    std::__cxx11::string::operator+=((string *)&in_RSI->attribute_,(char)local_88);
    ucc = local_20;
    goto LAB_00109b28;
  }
LAB_0010b21e:
  return SUB82(this,0);
}

Assistant:

CheckedError Parser::Next() {
  doc_comment_.clear();
  prev_cursor_ = cursor_;
  bool seen_newline = cursor_ == source_;
  attribute_.clear();
  attr_is_trivial_ascii_string_ = true;
  for (;;) {
    char c = *cursor_++;
    token_ = c;
    switch (c) {
      case '\0':
        cursor_--;
        token_ = kTokenEof;
        return NoError();
      case ' ':
      case '\r':
      case '\t': break;
      case '\n':
        MarkNewLine();
        seen_newline = true;
        break;
      case '{':
      case '}':
      case '(':
      case ')':
      case '[':
      case ']':
      case '<':
      case '>':
      case ',':
      case ':':
      case ';':
      case '=': return NoError();
      case '\"':
      case '\'': {
        int unicode_high_surrogate = -1;

        while (*cursor_ != c) {
          if (*cursor_ < ' ' && static_cast<signed char>(*cursor_) >= 0)
            return Error("illegal character in string constant");
          if (*cursor_ == '\\') {
            attr_is_trivial_ascii_string_ = false;  // has escape sequence
            cursor_++;
            if (unicode_high_surrogate != -1 && *cursor_ != 'u') {
              return Error(
                  "illegal Unicode sequence (unpaired high surrogate)");
            }
            switch (*cursor_) {
              case 'n':
                attribute_ += '\n';
                cursor_++;
                break;
              case 't':
                attribute_ += '\t';
                cursor_++;
                break;
              case 'r':
                attribute_ += '\r';
                cursor_++;
                break;
              case 'b':
                attribute_ += '\b';
                cursor_++;
                break;
              case 'f':
                attribute_ += '\f';
                cursor_++;
                break;
              case '\"':
                attribute_ += '\"';
                cursor_++;
                break;
              case '\'':
                attribute_ += '\'';
                cursor_++;
                break;
              case '\\':
                attribute_ += '\\';
                cursor_++;
                break;
              case '/':
                attribute_ += '/';
                cursor_++;
                break;
              case 'x': {  // Not in the JSON standard
                cursor_++;
                uint64_t val;
                ECHECK(ParseHexNum(2, &val));
                attribute_ += static_cast<char>(val);
                break;
              }
              case 'u': {
                cursor_++;
                uint64_t val;
                ECHECK(ParseHexNum(4, &val));
                if (val >= 0xD800 && val <= 0xDBFF) {
                  if (unicode_high_surrogate != -1) {
                    return Error(
                        "illegal Unicode sequence (multiple high surrogates)");
                  } else {
                    unicode_high_surrogate = static_cast<int>(val);
                  }
                } else if (val >= 0xDC00 && val <= 0xDFFF) {
                  if (unicode_high_surrogate == -1) {
                    return Error(
                        "illegal Unicode sequence (unpaired low surrogate)");
                  } else {
                    int code_point = 0x10000 +
                                     ((unicode_high_surrogate & 0x03FF) << 10) +
                                     (val & 0x03FF);
                    ToUTF8(code_point, &attribute_);
                    unicode_high_surrogate = -1;
                  }
                } else {
                  if (unicode_high_surrogate != -1) {
                    return Error(
                        "illegal Unicode sequence (unpaired high surrogate)");
                  }
                  ToUTF8(static_cast<int>(val), &attribute_);
                }
                break;
              }
              default: return Error("unknown escape code in string constant");
            }
          } else {  // printable chars + UTF-8 bytes
            if (unicode_high_surrogate != -1) {
              return Error(
                  "illegal Unicode sequence (unpaired high surrogate)");
            }
            // reset if non-printable
            attr_is_trivial_ascii_string_ &=
                check_ascii_range(*cursor_, ' ', '~');

            attribute_ += *cursor_++;
          }
        }
        if (unicode_high_surrogate != -1) {
          return Error("illegal Unicode sequence (unpaired high surrogate)");
        }
        cursor_++;
        if (!attr_is_trivial_ascii_string_ && !opts.allow_non_utf8 &&
            !ValidateUTF8(attribute_)) {
          return Error("illegal UTF-8 sequence");
        }
        token_ = kTokenStringConstant;
        return NoError();
      }
      case '/':
        if (*cursor_ == '/') {
          const char *start = ++cursor_;
          while (*cursor_ && *cursor_ != '\n' && *cursor_ != '\r') cursor_++;
          if (*start == '/') {  // documentation comment
            if (!seen_newline)
              return Error(
                  "a documentation comment should be on a line on its own");
            doc_comment_.push_back(std::string(start + 1, cursor_));
          }
          break;
        } else if (*cursor_ == '*') {
          cursor_++;
          // TODO: make nested.
          while (*cursor_ != '*' || cursor_[1] != '/') {
            if (*cursor_ == '\n') MarkNewLine();
            if (!*cursor_) return Error("end of file in comment");
            cursor_++;
          }
          cursor_ += 2;
          break;
        }
        FLATBUFFERS_FALLTHROUGH();  // else fall thru
      default:
        if (IsIdentifierStart(c)) {
          // Collect all chars of an identifier:
          const char *start = cursor_ - 1;
          while (IsIdentifierStart(*cursor_) || is_digit(*cursor_)) cursor_++;
          attribute_.append(start, cursor_);
          token_ = kTokenIdentifier;
          return NoError();
        }

        const auto has_sign = (c == '+') || (c == '-');
        if (has_sign) {
          // Check for +/-inf which is considered a float constant.
          if (strncmp(cursor_, "inf", 3) == 0 &&
              !(IsIdentifierStart(cursor_[3]) || is_digit(cursor_[3]))) {
            attribute_.assign(cursor_ - 1, cursor_ + 3);
            token_ = kTokenFloatConstant;
            cursor_ += 3;
            return NoError();
          }

          if (IsIdentifierStart(*cursor_)) {
            // '-'/'+' and following identifier - it could be a predefined
            // constant. Return the sign in token_, see ParseSingleValue.
            return NoError();
          }
        }

        auto dot_lvl =
            (c == '.') ? 0 : 1;  // dot_lvl==0 <=> exactly one '.' seen
        if (!dot_lvl && !is_digit(*cursor_)) return NoError();  // enum?
        // Parser accepts hexadecimal-floating-literal (see C++ 5.13.4).
        if (is_digit(c) || has_sign || !dot_lvl) {
          const auto start = cursor_ - 1;
          auto start_digits = !is_digit(c) ? cursor_ : cursor_ - 1;
          if (!is_digit(c) && is_digit(*cursor_)) {
            start_digits = cursor_;  // see digit in cursor_ position
            c = *cursor_++;
          }
          // hex-float can't begind with '.'
          auto use_hex = dot_lvl && (c == '0') && is_alpha_char(*cursor_, 'X');
          if (use_hex) start_digits = ++cursor_;  // '0x' is the prefix, skip it
          // Read an integer number or mantisa of float-point number.
          do {
            if (use_hex) {
              while (is_xdigit(*cursor_)) cursor_++;
            } else {
              while (is_digit(*cursor_)) cursor_++;
            }
          } while ((*cursor_ == '.') && (++cursor_) && (--dot_lvl >= 0));
          // Exponent of float-point number.
          if ((dot_lvl >= 0) && (cursor_ > start_digits)) {
            // The exponent suffix of hexadecimal float number is mandatory.
            if (use_hex && !dot_lvl) start_digits = cursor_;
            if ((use_hex && is_alpha_char(*cursor_, 'P')) ||
                is_alpha_char(*cursor_, 'E')) {
              dot_lvl = 0;  // Emulate dot to signal about float-point number.
              cursor_++;
              if (*cursor_ == '+' || *cursor_ == '-') cursor_++;
              start_digits = cursor_;  // the exponent-part has to have digits
              // Exponent is decimal integer number
              while (is_digit(*cursor_)) cursor_++;
              if (*cursor_ == '.') {
                cursor_++;  // If see a dot treat it as part of invalid number.
                dot_lvl = -1;  // Fall thru to Error().
              }
            }
          }
          // Finalize.
          if ((dot_lvl >= 0) && (cursor_ > start_digits)) {
            attribute_.append(start, cursor_);
            token_ = dot_lvl ? kTokenIntegerConstant : kTokenFloatConstant;
            return NoError();
          } else {
            return Error("invalid number: " + std::string(start, cursor_));
          }
        }
        std::string ch;
        ch = c;
        if (false == check_ascii_range(c, ' ', '~'))
          ch = "code: " + NumToString(c);
        return Error("illegal character: " + ch);
    }
  }
}